

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_print_util.c
# Opt level: O1

void libpd_print_concatenator(char *s)

{
  char *__dest;
  void *pvVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  
  pvVar1 = libpd_mainimp.i_print_util;
  if (libpd_mainimp.i_print_util != (void *)0x0) {
    __dest = (char *)((long)libpd_mainimp.i_print_util + 8);
    *(undefined1 *)
     ((long)libpd_mainimp.i_print_util +
     (long)*(int *)((long)libpd_mainimp.i_print_util + 0x808) + 8) = 0;
    sVar3 = strlen(s);
    uVar4 = (uint)sVar3;
    if (0x7ff < (int)(uVar4 + *(int *)((long)pvVar1 + 0x808))) {
      iVar2 = 0x7ff - *(int *)((long)pvVar1 + 0x808);
      do {
        strncat(__dest,s,(long)iVar2);
        (**pvVar1)(__dest);
        s = s + iVar2;
        uVar4 = (int)sVar3 - iVar2;
        sVar3 = (size_t)uVar4;
        *(undefined4 *)((long)pvVar1 + 0x808) = 0;
        *(undefined1 *)((long)pvVar1 + 8) = 0;
        iVar2 = 0x7ff;
      } while (0x7ff < (int)uVar4);
    }
    strncat(__dest,s,(long)(int)uVar4);
    iVar2 = *(int *)((long)pvVar1 + 0x808);
    iVar5 = uVar4 + *(int *)((long)pvVar1 + 0x808);
    *(int *)((long)pvVar1 + 0x808) = iVar5;
    if ((iVar5 != 0 && SCARRY4(uVar4,iVar2) == iVar5 < 0) && (__dest[iVar5 - 1] == '\n')) {
      *(undefined1 *)((long)pvVar1 + (ulong)(iVar5 - 1) + 8) = 0;
      (**pvVar1)(__dest);
      *(undefined4 *)((long)pvVar1 + 0x808) = 0;
    }
  }
  return;
}

Assistant:

void libpd_print_concatenator(const char *s) {
  print_util *util = (print_util *)LIBPDSTUFF->i_print_util;
  if (!util) return;

  util->concat_buf[util->concat_len] = '\0';

  int len = (int)strlen(s);
  while (util->concat_len + len >= PRINT_LINE_SIZE) {
    int d = PRINT_LINE_SIZE - 1 - util->concat_len;
    strncat(util->concat_buf, s, d);
    util->concat_printhook(util->concat_buf);
    s += d;
    len -= d;
    util->concat_len = 0;
    util->concat_buf[0] = '\0';
  }

  strncat(util->concat_buf, s, len);
  util->concat_len += len;

  if (util->concat_len > 0 && util->concat_buf[util->concat_len - 1] == '\n') {
    util->concat_buf[util->concat_len - 1] = '\0';
    util->concat_printhook(util->concat_buf);
    util->concat_len = 0;
  }
}